

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

ch_context * ch_vm_newcontext(ch_program program)

{
  ch_context *in_RDI;
  uint8_t *in_stack_00000008;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  uint in_stack_00000020;
  undefined4 in_stack_00000024;
  
  in_RDI->pstart = in_stack_00000008;
  in_RDI->pend = in_stack_00000008 + in_stack_00000018;
  in_RDI->pcurrent = in_stack_00000008 + in_stack_00000020 + in_stack_00000010;
  in_RDI->data_size = in_stack_00000010;
  ch_stack_create();
  memset(&in_RDI->call_stack,0,0x180c);
  in_RDI->open_upvalues = (ch_upvalue *)0x0;
  (in_RDI->globals).entries = (ch_table_entry *)0x0;
  (in_RDI->globals).capacity = 0;
  (in_RDI->globals).size = 0;
  (in_RDI->strings).entries = (ch_table_entry *)0x0;
  (in_RDI->strings).capacity = 0;
  (in_RDI->strings).size = 0;
  (in_RDI->program).start = in_stack_00000008;
  (in_RDI->program).data_size = in_stack_00000010;
  (in_RDI->program).total_size = in_stack_00000018;
  *(ulong *)&(in_RDI->program).program_start_ptr = CONCAT44(in_stack_00000024,in_stack_00000020);
  (in_RDI->program_return_value).type = PRIMITIVE_NULL;
  (in_RDI->program_return_value).field_1.number_value = 0.0;
  ch_table_create(&in_RDI->globals);
  ch_table_create(&in_RDI->strings);
  return in_RDI;
}

Assistant:

ch_context ch_vm_newcontext(ch_program program) {
  ch_context context = {
      .pstart = program.start,
      .pend = program.start + program.total_size,
      // Seek after the data section
      .pcurrent = program.start + program.data_size + program.program_start_ptr,
      .data_size = program.data_size,
      .stack = ch_stack_create(),
      .call_stack =
          (ch_call_stack){
              .size = 0,
          },
      .exit = RUNNING,
      .program = program,
      .program_return_value = MAKE_NULL(),
      .open_upvalues=NULL
  };

  ch_table_create(&context.globals);
  ch_table_create(&context.strings);

  return context;
}